

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialBus.cpp
# Opt level: O1

void __thiscall Commodore::Serial::DebugPort::set_input(DebugPort *this,Line line,LineLevel value)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  this->input_levels_[line] = value;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Bus] ",6);
  switch((ulong)line) {
  case 0:
    pcVar4 = "Service request";
    break;
  case 1:
    pcVar4 = "Attention";
    break;
  case 2:
    pcVar4 = "Clock";
    break;
  case 3:
    pcVar4 = "Data";
    break;
  case 4:
    pcVar4 = "Reset";
    break;
  default:
    bVar1 = true;
    pcVar4 = (char *)0x0;
    goto LAB_0031dc5e;
  }
  bVar1 = false;
LAB_0031dc5e:
  if (bVar1) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5be310);
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is ",4);
  pcVar4 = "low";
  if (value != Low) {
    pcVar4 = "high";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,(ulong)value + 3);
  iVar2 = this->incoming_count_;
  if (iVar2 == 0) {
    this->incoming_count_ = ((byte)~(this->input_levels_[3] | this->input_levels_[2]) & 1) << 3;
  }
  else {
    if (value == High && line == Clock) {
      (this->super_Port).field_0x1d =
           this->input_levels_[3] << 7 | (byte)(this->super_Port).field_0x1d >> 1;
    }
    iVar2 = iVar2 + -1;
    this->incoming_count_ = iVar2;
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Bus] Observed value ",0x15);
      *(uint *)(&unsigned_int::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&unsigned_int::typeinfo + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&std::cout,(uint)(byte)(this->super_Port).field_0x1d);
      return;
    }
  }
  return;
}

Assistant:

void DebugPort::set_input(Line line, LineLevel value) {
	input_levels_[line] = value;

	std::cout << "[Bus] " << StringForLine(line) << " is " << (value ? "high" : "low");
	if(!incoming_count_) {
		incoming_count_ = (!input_levels_[Line::Clock] && !input_levels_[Line::Data]) ? 8 : 0;
	} else {
		if(line == Line::Clock && value) {
			incoming_byte_ = (incoming_byte_ >> 1) | (input_levels_[Line::Data] ? 0x80 : 0x00);
		}
		incoming_count_--;
		if(incoming_count_ == 0) std::cout << "[Bus] Observed value " << std::hex << int(incoming_byte_);
	}
}